

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool Js::DynamicProfileInfo::IsEnabled(FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  bool local_21;
  byte local_11;
  FunctionBody *functionBody_local;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0xea,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = IsEnabled_OptionalFunctionBody(functionBody,scriptContext);
  local_11 = 0;
  if (bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,WasmInOutPhase);
    local_21 = false;
    if (bVar2) {
      local_21 = ParseableFunctionInfo::IsWasmFunction(&functionBody->super_ParseableFunctionInfo);
    }
    local_11 = local_21 ^ 0xff;
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool DynamicProfileInfo::IsEnabled(const FunctionBody *const functionBody)
    {
        Assert(functionBody);
        return (IsEnabled_OptionalFunctionBody(functionBody, functionBody->GetScriptContext())
#ifdef ENABLE_WASM
            && !(PHASE_TRACE1(Js::WasmInOutPhase) && functionBody->IsWasmFunction())
#endif
            );
    }